

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_tar.c
# Opt level: O1

wchar_t tar_read_header(archive_read *a,tar *tar,archive_entry *entry,size_t *unconsumed)

{
  char *pcVar1;
  char cVar2;
  byte bVar3;
  wchar_t wVar4;
  int iVar5;
  wchar_t wVar6;
  archive_read *a_00;
  long lVar7;
  char *pcVar8;
  void *h;
  size_t *in_R8;
  ulong uVar9;
  ssize_t bytes;
  ulong local_38;
  
  do {
    if (*unconsumed != 0) {
      __archive_read_consume(a,*unconsumed);
      *unconsumed = 0;
    }
    h = (void *)0x200;
    a_00 = (archive_read *)__archive_read_ahead(a,0x200,(ssize_t *)&local_38);
    if ((long)local_38 < 0) {
      uVar9 = local_38 & 0xffffffff;
      goto LAB_00131833;
    }
    uVar9 = 1;
    if (local_38 == 0) goto LAB_00131833;
    if ((long)local_38 < 0x200) {
      archive_set_error(&a->archive,0x54,"Truncated tar archive");
      uVar9 = 0xffffffe2;
      goto LAB_00131833;
    }
    *unconsumed = 0x200;
    if ((char)(a_00->archive).magic != '\0') {
LAB_00131595:
      wVar4 = checksum(a_00,h);
      if (wVar4 == L'\0') {
        __archive_read_consume(a,0x200);
        *unconsumed = 0;
        archive_set_error(&a->archive,0x16,"Damaged tar archive");
        uVar9 = 0xfffffff6;
        goto LAB_00131833;
      }
      iVar5 = tar->header_recursion_depth;
      tar->header_recursion_depth = iVar5 + 1;
      if (iVar5 < 0x20) {
        bVar3 = *(byte *)((long)&a_00->read_data_offset + 4);
        if (bVar3 < 0x56) {
          if (bVar3 == 0x41) {
            (a->archive).archive_format = 0x30002;
            (a->archive).archive_format_name = "Solaris tar";
            in_R8 = unconsumed;
            wVar4 = header_Solaris_ACL(a,tar,entry,a_00,unconsumed);
          }
          else if (bVar3 == 0x4b) {
            in_R8 = unconsumed;
            wVar4 = header_longlink(a,tar,entry,a_00,unconsumed);
          }
          else {
            if (bVar3 != 0x4c) goto LAB_0013171b;
            in_R8 = unconsumed;
            wVar4 = header_longname(a,tar,entry,a_00,unconsumed);
          }
        }
        else if (bVar3 < 0x67) {
          if (bVar3 == 0x56) {
            wVar4 = tar_read_header(a,tar,entry,unconsumed);
          }
          else {
            if (bVar3 != 0x58) goto LAB_0013171b;
            (a->archive).archive_format = 0x30002;
            pcVar8 = "POSIX pax interchange format (Sun variant)";
LAB_001316d3:
            (a->archive).archive_format_name = pcVar8;
            in_R8 = unconsumed;
            wVar4 = header_pax_extensions(a,tar,entry,a_00,unconsumed);
          }
        }
        else if (bVar3 == 0x67) {
          (a->archive).archive_format = 0x30002;
          (a->archive).archive_format_name = "POSIX pax interchange format";
          in_R8 = unconsumed;
          wVar4 = header_pax_global(a,tar,entry,a_00,unconsumed);
          if (wVar4 == L'\x01') goto LAB_00131833;
        }
        else {
          if (bVar3 == 0x78) {
            (a->archive).archive_format = 0x30002;
            pcVar8 = "POSIX pax interchange format";
            goto LAB_001316d3;
          }
LAB_0013171b:
          if (*(long *)((long)&(a_00->client).dataset + 1) == 0x20207261747375) {
            (a->archive).archive_format = 0x30004;
            (a->archive).archive_format_name = "GNU tar format";
            in_R8 = unconsumed;
            wVar4 = header_gnutar(a,tar,entry,a_00,unconsumed);
          }
          else if (*(char *)((long)&(a_00->client).dataset + 5) == 'r' &&
                   *(int *)((long)&(a_00->client).dataset + 1) == 0x61747375) {
            if ((a->archive).archive_format != 0x30002) {
              (a->archive).archive_format = 0x30001;
              (a->archive).archive_format_name = "POSIX ustar format";
            }
            wVar4 = header_ustar(a,tar,entry,a_00);
          }
          else {
            (a->archive).archive_format = 0x30000;
            (a->archive).archive_format_name = "tar (non-POSIX)";
            wVar4 = header_old_tar(a,tar,entry,a_00);
          }
        }
        uVar9 = 0xffffffe2;
        if (wVar4 == L'\xffffffe2') goto LAB_00131833;
        if (*unconsumed != 0) {
          __archive_read_consume(a,*unconsumed);
          *unconsumed = 0;
        }
        iVar5 = tar->header_recursion_depth + -1;
        tar->header_recursion_depth = iVar5;
        if ((((wVar4 == L'\0') || (wVar4 == L'\xffffffec')) && (iVar5 == 0)) &&
           ((tar->process_mac_extensions != 0 &&
            (wVar6 = read_mac_metadata_blob(a,tar,entry,unconsumed,in_R8), wVar6 < wVar4)))) {
          wVar4 = wVar6;
        }
        if (wVar4 != L'\xffffffec') {
          if (wVar4 == L'\x01') {
            archive_set_error(&a->archive,0x16,"Damaged tar archive");
            goto LAB_00131833;
          }
          if (wVar4 != L'\0') goto LAB_00131833;
        }
        if (tar->sparse_gnu_pending != '\0') {
          if ((tar->sparse_gnu_major != 1) || (tar->sparse_gnu_minor != 0)) {
            pcVar8 = "Unrecognized GNU sparse file format";
            iVar5 = -1;
            goto LAB_001315de;
          }
          tar->sparse_gnu_pending = '\0';
          uVar9 = gnu_sparse_10_read(a,tar,unconsumed);
          tar->entry_bytes_remaining = tar->entry_bytes_remaining - uVar9;
          if ((long)uVar9 < 0) goto LAB_00131833;
          tar->sparse_gnu_pending = '\0';
        }
        uVar9 = (ulong)(uint)wVar4;
      }
      else {
        __archive_read_consume(a,0x200);
        *unconsumed = 0;
        pcVar8 = "Too many special headers";
        iVar5 = 0x16;
LAB_001315de:
        archive_set_error(&a->archive,iVar5,pcVar8);
        uVar9 = 0xffffffec;
      }
      goto LAB_00131833;
    }
    lVar7 = 0;
    do {
      cVar2 = *(char *)((long)&(a_00->archive).magic + lVar7);
      if (cVar2 != '\0') break;
      iVar5 = (int)lVar7;
      lVar7 = lVar7 + 1;
    } while (iVar5 != 0x1ff);
    if (cVar2 != '\0') goto LAB_00131595;
    if ((a->archive).archive_format_name == (char *)0x0) {
      (a->archive).archive_format = 0x30000;
      (a->archive).archive_format_name = "tar";
    }
  } while (tar->read_concatenated_archives != 0);
  __archive_read_consume(a,0x200);
  *unconsumed = 0;
  pcVar8 = (char *)__archive_read_ahead(a,0x200,(ssize_t *)0x0);
  if ((pcVar8 != (char *)0x0) && (*pcVar8 == '\0')) {
    lVar7 = 0;
    do {
      pcVar1 = pcVar8 + lVar7;
      if (*pcVar1 != '\0') break;
      iVar5 = (int)lVar7;
      lVar7 = lVar7 + 1;
    } while (iVar5 != 0x1ff);
    if (*pcVar1 == '\0') {
      __archive_read_consume(a,0x200);
    }
  }
  archive_clear_error(&a->archive);
LAB_00131833:
  return (wchar_t)uVar9;
}

Assistant:

static int
tar_read_header(struct archive_read *a, struct tar *tar,
    struct archive_entry *entry, size_t *unconsumed)
{
	ssize_t bytes;
	int err;
	const char *h;
	const struct archive_entry_header_ustar *header;
	const struct archive_entry_header_gnutar *gnuheader;

	/* Loop until we find a workable header record. */
	for (;;) {
		tar_flush_unconsumed(a, unconsumed);

		/* Read 512-byte header record */
		h = __archive_read_ahead(a, 512, &bytes);
		if (bytes < 0)
			return ((int)bytes);
		if (bytes == 0) { /* EOF at a block boundary. */
			/* Some writers do omit the block of nulls. <sigh> */
			return (ARCHIVE_EOF);
		}
		if (bytes < 512) {  /* Short block at EOF; this is bad. */
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_FILE_FORMAT,
			    "Truncated tar archive");
			return (ARCHIVE_FATAL);
		}
		*unconsumed = 512;

		/* Header is workable if it's not an end-of-archive mark. */
		if (h[0] != 0 || !archive_block_is_null(h))
			break;

		/* Ensure format is set for archives with only null blocks. */
		if (a->archive.archive_format_name == NULL) {
			a->archive.archive_format = ARCHIVE_FORMAT_TAR;
			a->archive.archive_format_name = "tar";
		}

		if (!tar->read_concatenated_archives) {
			/* Try to consume a second all-null record, as well. */
			tar_flush_unconsumed(a, unconsumed);
			h = __archive_read_ahead(a, 512, NULL);
			if (h != NULL && h[0] == 0 && archive_block_is_null(h))
				__archive_read_consume(a, 512);
			archive_clear_error(&a->archive);
			return (ARCHIVE_EOF);
		}

		/*
		 * We're reading concatenated archives, ignore this block and
		 * loop to get the next.
		 */
	}

	/*
	 * Note: If the checksum fails and we return ARCHIVE_RETRY,
	 * then the client is likely to just retry.  This is a very
	 * crude way to search for the next valid header!
	 *
	 * TODO: Improve this by implementing a real header scan.
	 */
	if (!checksum(a, h)) {
		tar_flush_unconsumed(a, unconsumed);
		archive_set_error(&a->archive, EINVAL, "Damaged tar archive");
		return (ARCHIVE_RETRY); /* Retryable: Invalid header */
	}

	if (++tar->header_recursion_depth > 32) {
		tar_flush_unconsumed(a, unconsumed);
		archive_set_error(&a->archive, EINVAL, "Too many special headers");
		return (ARCHIVE_WARN);
	}

	/* Determine the format variant. */
	header = (const struct archive_entry_header_ustar *)h;

	switch(header->typeflag[0]) {
	case 'A': /* Solaris tar ACL */
		a->archive.archive_format = ARCHIVE_FORMAT_TAR_PAX_INTERCHANGE;
		a->archive.archive_format_name = "Solaris tar";
		err = header_Solaris_ACL(a, tar, entry, h, unconsumed);
		break;
	case 'g': /* POSIX-standard 'g' header. */
		a->archive.archive_format = ARCHIVE_FORMAT_TAR_PAX_INTERCHANGE;
		a->archive.archive_format_name = "POSIX pax interchange format";
		err = header_pax_global(a, tar, entry, h, unconsumed);
		if (err == ARCHIVE_EOF)
			return (err);
		break;
	case 'K': /* Long link name (GNU tar, others) */
		err = header_longlink(a, tar, entry, h, unconsumed);
		break;
	case 'L': /* Long filename (GNU tar, others) */
		err = header_longname(a, tar, entry, h, unconsumed);
		break;
	case 'V': /* GNU volume header */
		err = header_volume(a, tar, entry, h, unconsumed);
		break;
	case 'X': /* Used by SUN tar; same as 'x'. */
		a->archive.archive_format = ARCHIVE_FORMAT_TAR_PAX_INTERCHANGE;
		a->archive.archive_format_name =
		    "POSIX pax interchange format (Sun variant)";
		err = header_pax_extensions(a, tar, entry, h, unconsumed);
		break;
	case 'x': /* POSIX-standard 'x' header. */
		a->archive.archive_format = ARCHIVE_FORMAT_TAR_PAX_INTERCHANGE;
		a->archive.archive_format_name = "POSIX pax interchange format";
		err = header_pax_extensions(a, tar, entry, h, unconsumed);
		break;
	default:
		gnuheader = (const struct archive_entry_header_gnutar *)h;
		if (memcmp(gnuheader->magic, "ustar  \0", 8) == 0) {
			a->archive.archive_format = ARCHIVE_FORMAT_TAR_GNUTAR;
			a->archive.archive_format_name = "GNU tar format";
			err = header_gnutar(a, tar, entry, h, unconsumed);
		} else if (memcmp(header->magic, "ustar", 5) == 0) {
			if (a->archive.archive_format != ARCHIVE_FORMAT_TAR_PAX_INTERCHANGE) {
				a->archive.archive_format = ARCHIVE_FORMAT_TAR_USTAR;
				a->archive.archive_format_name = "POSIX ustar format";
			}
			err = header_ustar(a, tar, entry, h);
		} else {
			a->archive.archive_format = ARCHIVE_FORMAT_TAR;
			a->archive.archive_format_name = "tar (non-POSIX)";
			err = header_old_tar(a, tar, entry, h);
		}
	}
	if (err == ARCHIVE_FATAL)
		return (err);

	tar_flush_unconsumed(a, unconsumed);

	h = NULL;
	header = NULL;

	--tar->header_recursion_depth;
	/* Yuck.  Apple's design here ends up storing long pathname
	 * extensions for both the AppleDouble extension entry and the
	 * regular entry.
	 */
	if ((err == ARCHIVE_WARN || err == ARCHIVE_OK) &&
	    tar->header_recursion_depth == 0 &&
	    tar->process_mac_extensions) {
		int err2 = read_mac_metadata_blob(a, tar, entry, h, unconsumed);
		if (err2 < err)
			err = err2;
	}

	/* We return warnings or success as-is.  Anything else is fatal. */
	if (err == ARCHIVE_WARN || err == ARCHIVE_OK) {
		if (tar->sparse_gnu_pending) {
			if (tar->sparse_gnu_major == 1 &&
			    tar->sparse_gnu_minor == 0) {
				ssize_t bytes_read;

				tar->sparse_gnu_pending = 0;
				/* Read initial sparse map. */
				bytes_read = gnu_sparse_10_read(a, tar, unconsumed);
				tar->entry_bytes_remaining -= bytes_read;
				if (bytes_read < 0)
					return ((int)bytes_read);
			} else {
				archive_set_error(&a->archive,
				    ARCHIVE_ERRNO_MISC,
				    "Unrecognized GNU sparse file format");
				return (ARCHIVE_WARN);
			}
			tar->sparse_gnu_pending = 0;
		}
		return (err);
	}
	if (err == ARCHIVE_EOF)
		/* EOF when recursively reading a header is bad. */
		archive_set_error(&a->archive, EINVAL, "Damaged tar archive");
	return (ARCHIVE_FATAL);
}